

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printFPImmOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  _Bool _Var3;
  cs_ac_type cVar4;
  MCOperand *op;
  int64_t iVar5;
  char *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  float fVar6;
  SStream *ss;
  uint8_t access;
  double FPImm;
  MCOperand *MO;
  cs_struct *pcVar7;
  SStream *h;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  _Var3 = MCOperand_isFPImm(op);
  if (_Var3) {
    ss = (SStream *)MCOperand_getFPImm(op);
  }
  else {
    iVar5 = MCOperand_getImm(op);
    fVar6 = AArch64_AM_getFPImmFloat((uint)iVar5);
    ss = (SStream *)(double)fVar6;
  }
  h = ss;
  SStream_concat(ss,in_RDX,"#%.8f");
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    pcVar7 = in_RDI->csh;
    MCInst_getOpcode(in_RDI);
    cVar4 = get_op_access((cs_struct *)h,(uint)((ulong)pcVar7 >> 0x20),(uint)pcVar7);
    in_RDI->flat_insn->detail->groups
    [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar4;
    in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
    puVar1 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
    puVar1[0] = '\x04';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(SStream **)
     (in_RDI->flat_insn->detail->groups +
     (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) = ss;
    pcVar2 = in_RDI->flat_insn->detail;
    (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
  }
  return;
}

Assistant:

static void printFPImmOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO = MCInst_getOperand(MI, OpNum);
	double FPImm = MCOperand_isFPImm(MO) ? MCOperand_getFPImm(MO) : AArch64_AM_getFPImmFloat((int)MCOperand_getImm(MO));

	// 8 decimal places are enough to perfectly represent permitted floats.
#if defined(_KERNEL_MODE)
	// Issue #681: Windows kernel does not support formatting float point
	SStream_concat(O, "#<float_point_unsupported>");
#else
	SStream_concat(O, "#%.8f", FPImm);
#endif
	if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
		uint8_t access;
		access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
		MI->ac_idx++;
#endif
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_FP;
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].fp = FPImm;
		MI->flat_insn->detail->arm64.op_count++;
	}
}